

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

char __thiscall lexer::Lexer::peekChar(Lexer *this)

{
  reference pvVar1;
  
  if (this->readPosition < (int)(this->input)._M_string_length) {
    pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&this->input,(long)this->readPosition);
    return *pvVar1;
  }
  return '\0';
}

Assistant:

char Lexer::peekChar()
{
    if(readPosition >= (int) input.size()){
        return 0;
    }else{
        return input.at(readPosition);
    }
}